

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O1

void __thiscall
mocker::detail::ReassociationImpl::rebuild
          (ReassociationImpl *this,
          priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
          *q,iterator pos)

{
  size_t *psVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  pointer pRVar4;
  FunctionModule *pFVar5;
  ArithBinaryInst *pAVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined8 uVar8;
  int64_t iVar9;
  int iVar10;
  undefined8 uVar11;
  ReassociationImpl *pRVar12;
  iterator iVar13;
  _List_node_base *p_Var14;
  Addr *__tmp;
  ArithUnaryInst *pAVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  Addr AVar16;
  shared_ptr<mocker::ir::ArithBinaryInst> newInst;
  value_type rhs;
  shared_ptr<mocker::ir::Addr> lhsVal;
  value_type val;
  shared_ptr<mocker::ir::Reg> dest;
  bool local_ec [4];
  ArithBinaryInst *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d8 [16];
  ArithUnaryInst *local_c8;
  IntLiteral IStack_c0;
  int local_b0;
  undefined1 local_a8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  IntLiteral IStack_90;
  int local_80;
  undefined1 local_69;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ReassociationImpl *local_48;
  pointer local_40;
  pointer local_38;
  
  pBVar3 = this->bb;
  local_38 = (pointer)(pos._M_node + 1);
  ir::getDest((ir *)&local_58,(shared_ptr<mocker::ir::IRInst> *)local_38);
  pRVar4 = (q->c).
           super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(q->c).
            super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 == 0x20) {
    bVar2 = pRVar4->positive;
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_98._1_7_,bVar2);
    IStack_90.super_Addr._vptr_Addr =
         (_func_int **)
         (pRVar4->value).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    IStack_90.val =
         (int64_t)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(pRVar4->value).
                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> + 8))->
                  _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val)->_M_use_count + 1;
      }
    }
    local_80 = pRVar4->rank;
    if (bVar2 == true) {
      local_c8 = (ArithUnaryInst *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Assign,std::allocator<mocker::ir::Assign>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x18),
                 (Assign **)(local_d8 + 0x10),(allocator<mocker::ir::Assign> *)&local_e8,
                 (shared_ptr<mocker::ir::Reg> *)&local_58,(shared_ptr<mocker::ir::Addr> *)&IStack_90
                );
      AVar16._vptr_Addr = IStack_c0.super_Addr._vptr_Addr;
      pAVar15 = local_c8;
      local_c8 = (ArithUnaryInst *)0x0;
      IStack_c0.super_Addr._vptr_Addr = (_func_int **)0x0;
      p_Var14 = (_List_node_base *)operator_new(0x20);
    }
    else {
      local_e8 = (ArithBinaryInst *)((ulong)local_e8 & 0xffffffff00000000);
      local_c8 = (ArithUnaryInst *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::ArithUnaryInst,std::allocator<mocker::ir::ArithUnaryInst>,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x18),
                 (ArithUnaryInst **)(local_d8 + 0x10),
                 (allocator<mocker::ir::ArithUnaryInst> *)(local_d8 + 0x30),
                 (shared_ptr<mocker::ir::Reg> *)&local_58,(OpType *)&local_e8,
                 (shared_ptr<mocker::ir::Addr> *)&IStack_90);
      AVar16._vptr_Addr = IStack_c0.super_Addr._vptr_Addr;
      pAVar15 = local_c8;
      local_c8 = (ArithUnaryInst *)0x0;
      IStack_c0.super_Addr._vptr_Addr = (_func_int **)0x0;
      p_Var14 = (_List_node_base *)operator_new(0x20);
    }
    p_Var14[1]._M_next = (_List_node_base *)pAVar15;
    p_Var14[1]._M_prev = (_List_node_base *)AVar16._vptr_Addr;
    std::__detail::_List_node_base::_M_hook(p_Var14);
    psVar1 = &(pBVar3->insts).
              super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.super_Addr._vptr_Addr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.super_Addr._vptr_Addr);
    }
LAB_00173865:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val);
    }
  }
  else {
    pRVar12 = this;
    iVar13._M_node = pos._M_node;
    if ((q->c).
        super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (q->c).
        super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_40 = (pointer)iVar13._M_node;
        local_48 = pRVar12;
        ir::getDest((ir *)&local_98,(shared_ptr<mocker::ir::IRInst> *)local_38);
        uVar8 = local_58._8_8_;
        local_58._8_8_ = IStack_90.super_Addr._vptr_Addr;
        local_58._M_allocated_capacity = (size_type)local_98;
        local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        IStack_90.super_Addr._vptr_Addr = (_func_int **)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.super_Addr._vptr_Addr !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.super_Addr._vptr_Addr
                    );
        }
        pRVar4 = (q->c).
                 super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(local_98._1_7_,pRVar4->positive);
        IStack_90.super_Addr._vptr_Addr =
             (_func_int **)
             (pRVar4->value).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        IStack_90.val =
             (int64_t)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(pRVar4->value).
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> + 8))
                      ->_M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val)->_M_use_count + 1;
          }
        }
        local_80 = pRVar4->rank;
        std::
        priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
        ::pop(q);
        pRVar4 = (q->c).
                 super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pRVar4 == (q->c).
                      super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00173865;
        local_c8 = (ArithUnaryInst *)CONCAT71(local_c8._1_7_,pRVar4->positive);
        IStack_c0.super_Addr._vptr_Addr =
             (_func_int **)
             (pRVar4->value).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        IStack_c0.val =
             (int64_t)(pRVar4->value).
                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.val !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.val)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.val)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.val)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.val)->_M_use_count + 1;
          }
        }
        local_b0 = pRVar4->rank;
        std::
        priority_queue<mocker::detail::ReassociationImpl::RankedNode,_std::vector<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>,_std::less<mocker::detail::ReassociationImpl::RankedNode>_>
        ::pop(q);
        ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                  ((shared_ptr<mocker::ir::Addr> *)&local_e8,&IStack_90);
        if (local_e8 != (ArithBinaryInst *)0x0) {
          ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                    ((shared_ptr<mocker::ir::Addr> *)(local_d8 + 0x30),
                     (IntLiteral *)(local_d8 + 0x18));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            __assert_fail("!ir::dyc<ir::IntLiteral>(lhs.value) || !ir::dyc<ir::IntLiteral>(rhs.value)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                          ,0x132,
                          "void mocker::detail::ReassociationImpl::rebuild(std::priority_queue<detail::ReassociationImpl::RankedNode> &, std::list<std::shared_ptr<ir::IRInst>>::iterator)"
                         );
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
          }
        }
        if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
        }
        if ((q->c).
            super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (q->c).
            super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pFVar5 = this->func;
          local_e8 = (ArithBinaryInst *)local_d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          ir::FunctionModule::makeTempLocalReg
                    ((FunctionModule *)(local_d8 + 0x30),&pFVar5->identifier);
          uVar8 = local_58._8_8_;
          local_58._8_8_ = local_a8._8_8_;
          local_58._M_allocated_capacity = local_a8._0_8_;
          local_a8._0_8_ = 0;
          local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
          }
          if (local_e8 != (ArithBinaryInst *)local_d8) {
            operator_delete(local_e8,local_d8._0_8_ + 1);
          }
        }
        iVar10 = local_80;
        iVar9 = IStack_90.val;
        AVar16._vptr_Addr = IStack_90.super_Addr._vptr_Addr;
        if (local_98._0_1_ == (ir)0x0) {
          local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71(local_98._1_7_,(byte)local_c8);
          local_c8 = (ArithUnaryInst *)((ulong)local_c8 & 0xffffffffffffff00);
          local_80 = local_b0;
          IStack_90.val = IStack_c0.val;
          IStack_90.super_Addr._vptr_Addr = IStack_c0.super_Addr._vptr_Addr;
          IStack_c0.val = iVar9;
          IStack_c0.super_Addr._vptr_Addr = AVar16._vptr_Addr;
          local_b0 = iVar10;
          this = local_48;
        }
        local_a8._0_8_ = IStack_90.super_Addr._vptr_Addr;
        local_a8._8_8_ = IStack_90.val;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(IStack_90.val + 8) = *(_Atomic_word *)(IStack_90.val + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(IStack_90.val + 8) = *(_Atomic_word *)(IStack_90.val + 8) + 1;
          }
        }
        if (local_98._0_1_ == (ir)0x0) {
          pFVar5 = this->func;
          local_e8 = (ArithBinaryInst *)local_d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_68,&pFVar5->identifier);
          uVar11 = local_68._8_8_;
          local_a8._0_8_ = local_68._0_8_;
          uVar8 = local_a8._8_8_;
          local_68._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_a8._8_8_ = uVar11;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          }
          if (local_e8 != (ArithBinaryInst *)local_d8) {
            operator_delete(local_e8,local_d8._0_8_ + 1);
          }
          ir::dycLocalReg((ir *)local_68,(shared_ptr<mocker::ir::Addr> *)(local_d8 + 0x30));
          local_ec[0] = false;
          local_ec[1] = false;
          local_ec[2] = false;
          local_ec[3] = false;
          local_e8 = (ArithBinaryInst *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::ir::ArithUnaryInst,std::allocator<mocker::ir::ArithUnaryInst>,std::shared_ptr<mocker::ir::Reg>,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&>
                    (&local_e0,(ArithUnaryInst **)&local_e8,
                     (allocator<mocker::ir::ArithUnaryInst> *)&local_69,
                     (shared_ptr<mocker::ir::Reg> *)local_68,(OpType *)local_ec,
                     (shared_ptr<mocker::ir::Addr> *)&IStack_90);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          }
          _Var7._M_pi = local_e0._M_pi;
          pAVar6 = local_e8;
          if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
            }
          }
          p_Var14 = (_List_node_base *)operator_new(0x20);
          p_Var14[1]._M_next = (_List_node_base *)pAVar6;
          p_Var14[1]._M_prev = (_List_node_base *)_Var7._M_pi;
          std::__detail::_List_node_base::_M_hook(p_Var14);
          psVar1 = &(pBVar3->insts).
                    super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
          }
        }
        local_68._0_4_ = 6 - (uint)(byte)local_c8;
        local_e8 = (ArithBinaryInst *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                  (&local_e0,&local_e8,(allocator<mocker::ir::ArithBinaryInst> *)local_ec,
                   (shared_ptr<mocker::ir::Reg> *)&local_58,(OpType *)local_68,
                   (shared_ptr<mocker::ir::Addr> *)(local_d8 + 0x30),
                   (shared_ptr<mocker::ir::Addr> *)(local_d8 + 0x18));
        _Var7._M_pi = local_e0._M_pi;
        pAVar6 = local_e8;
        if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
          }
        }
        p_Var14 = (_List_node_base *)operator_new(0x20);
        p_Var14[1]._M_next = (_List_node_base *)pAVar6;
        p_Var14[1]._M_prev = (_List_node_base *)_Var7._M_pi;
        std::__detail::_List_node_base::_M_hook(p_Var14);
        psVar1 = &(pBVar3->insts).
                  super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if ((q->c).
            super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (q->c).
            super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_ec[0] = true;
          local_68._0_4_ = local_b0 + local_80;
          std::
          priority_queue<mocker::detail::ReassociationImpl::RankedNode,std::vector<mocker::detail::ReassociationImpl::RankedNode,std::allocator<mocker::detail::ReassociationImpl::RankedNode>>,std::less<mocker::detail::ReassociationImpl::RankedNode>>
          ::emplace<bool,std::shared_ptr<mocker::ir::Reg>&,int>
                    ((priority_queue<mocker::detail::ReassociationImpl::RankedNode,std::vector<mocker::detail::ReassociationImpl::RankedNode,std::allocator<mocker::detail::ReassociationImpl::RankedNode>>,std::less<mocker::detail::ReassociationImpl::RankedNode>>
                      *)q,local_ec,(shared_ptr<mocker::ir::Reg> *)&local_58,(int *)local_68);
        }
        if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.val !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_c0.val);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)IStack_90.val);
        }
        pRVar12 = local_48;
        iVar13._M_node = (_List_node_base *)local_40;
      } while ((q->c).
               super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (q->c).
               super__Vector_base<mocker::detail::ReassociationImpl::RankedNode,_std::allocator<mocker::detail::ReassociationImpl::RankedNode>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return;
}

Assistant:

void detail::ReassociationImpl::rebuild(
    std::priority_queue<detail::ReassociationImpl::RankedNode> &q,
    std::list<std::shared_ptr<ir::IRInst>>::iterator pos) {
  auto &insts = bb.getMutableInsts();
  auto dest = ir::getDest(*pos);

  //  std::cerr << "rebuilding: " <<  ir::fmtAddr(dest) << std::endl;

  if (q.size() == 1) {
    auto val = q.top();
    if (val.positive)
      insts.insert(pos, std::make_shared<ir::Assign>(dest, val.value));
    else
      insts.insert(pos, std::make_shared<ir::ArithUnaryInst>(
                            dest, ir::ArithUnaryInst::Neg, val.value));
    return;
  }

  while (!q.empty()) {
    dest = ir::getDest(*pos);
    auto lhs = q.top();
    q.pop();
    if (q.empty())
      return;
    auto rhs = q.top();
    q.pop();

    assert(!ir::dyc<ir::IntLiteral>(lhs.value) ||
           !ir::dyc<ir::IntLiteral>(rhs.value));

    if (!q.empty())
      dest = func.makeTempLocalReg();

    // emit
    if (!lhs.positive)
      std::swap(lhs, rhs);
    auto lhsVal = lhs.value;
    if (!lhs.positive) {
      lhsVal = func.makeTempLocalReg();
      auto newInst = std::make_shared<ir::ArithUnaryInst>(
          ir::dycLocalReg(lhsVal), ir::ArithUnaryInst::Neg, lhs.value);
      insts.insert(pos, newInst);
    }
    auto newInst = std::make_shared<ir::ArithBinaryInst>(
        dest,
        rhs.positive ? ir::ArithBinaryInst::Add : ir::ArithBinaryInst::Sub,
        lhsVal, rhs.value);
    insts.insert(pos, newInst);
    if (!q.empty()) {
      q.emplace(true, dest, lhs.rank + rhs.rank);
    }
  }
}